

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void sglr::clearToTextureInitialValue(PixelBufferAccess *access)

{
  ChannelOrder CVar1;
  Vec4 local_18;
  
  CVar1 = (access->super_ConstPixelBufferAccess).m_format.order;
  if (CVar1 == DS) {
    tcu::clearDepth(access,0.0);
  }
  else if (CVar1 != S) {
    if (CVar1 == D) {
      tcu::clearDepth(access,0.0);
      return;
    }
    local_18.m_data[0] = 0.0;
    local_18.m_data[1] = 0.0;
    local_18.m_data[2] = 0.0;
    local_18.m_data[3] = 1.0;
    tcu::clear(access,&local_18);
    return;
  }
  tcu::clearStencil(access,0);
  return;
}

Assistant:

static void clearToTextureInitialValue (PixelBufferAccess access)
{
	const bool hasDepth		= access.getFormat().order == tcu::TextureFormat::D || access.getFormat().order == tcu::TextureFormat::DS;
	const bool hasStencil	= access.getFormat().order == tcu::TextureFormat::S || access.getFormat().order == tcu::TextureFormat::DS;
	const bool hasColor		= !hasDepth && !hasStencil;

	if (hasDepth)
		tcu::clearDepth(access, 0.0f);
	if (hasStencil)
		tcu::clearStencil(access, 0u);
	if (hasColor)
		tcu::clear(access, Vec4(0.0f, 0.0f, 0.0f, 1.0f));
}